

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O2

bool __thiscall
webrtc::TraceImpl::UpdateFileName
          (TraceImpl *this,char *file_name_utf8,char *file_name_with_counter_utf8,uint32_t new_count
          )

{
  size_t sVar1;
  ulong uVar2;
  size_t __n;
  uint uVar3;
  ulong uVar4;
  
  sVar1 = strlen(file_name_utf8);
  uVar3 = (uint)sVar1;
  if (-1 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    do {
      uVar2 = uVar4 - 1;
      if ((long)uVar4 < 2) break;
      uVar4 = uVar2;
    } while (file_name_utf8[uVar2] != '.');
    if (uVar2 == 0) {
      uVar2 = sVar1;
    }
    uVar4 = uVar2 & 0xffffffff;
    sVar1 = (long)((int)uVar2 + -1);
    do {
      __n = sVar1;
      if ((int)uVar4 < 2) break;
      uVar4 = uVar4 - 1;
      sVar1 = __n - 1;
    } while (file_name_utf8[uVar4 & 0xffffffff] != '_');
    memcpy(file_name_with_counter_utf8,file_name_utf8,__n);
    sprintf(file_name_with_counter_utf8 + __n,"_%lu%s",(ulong)new_count,file_name_utf8 + (int)uVar2)
    ;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TraceImpl::UpdateFileName(
    const char file_name_utf8[FileWrapper::kMaxFileNameSize],
    char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize],
    const uint32_t new_count) const {
  int32_t length = (int32_t)strlen(file_name_utf8);
  if (length < 0) {
    return false;
  }

  int32_t length_without_file_ending = length - 1;
  while (length_without_file_ending > 0) {
    if (file_name_utf8[length_without_file_ending] == '.') {
      break;
    } else {
      length_without_file_ending--;
    }
  }
  if (length_without_file_ending == 0) {
    length_without_file_ending = length;
  }
  int32_t length_to_ = length_without_file_ending - 1;
  while (length_to_ > 0) {
    if (file_name_utf8[length_to_] == '_') {
      break;
    } else {
      length_to_--;
    }
  }

  memcpy(file_name_with_counter_utf8, file_name_utf8, length_to_);
  sprintf(file_name_with_counter_utf8 + length_to_, "_%lu%s",
          static_cast<long unsigned int>(new_count),
          file_name_utf8 + length_without_file_ending);
  return true;
}